

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O2

CordzInfo * absl::lts_20250127::cord_internal::CordzInfo::Head(CordzSnapshot *snapshot)

{
  undefined8 uVar1;
  bool bVar2;
  
  uVar1 = global_list_._8_8_;
  if (snapshot[8] == (CordzSnapshot)0x0) {
    __assert_fail("false && \"snapshot.is_snapshot()\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                  ,0xe5,
                  "auto absl::cord_internal::CordzInfo::Head(const CordzSnapshot &)::(anonymous class)::operator()() const"
                 );
  }
  bVar2 = CordzHandle::DiagnosticsHandleIsSafeToInspect
                    ((CordzHandle *)snapshot,(CordzHandle *)global_list_._8_8_);
  if (bVar2) {
    return (CordzInfo *)uVar1;
  }
  __assert_fail("false && \"snapshot.DiagnosticsHandleIsSafeToInspect(head)\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                ,0xee,
                "auto absl::cord_internal::CordzInfo::Head(const CordzSnapshot &)::(anonymous class)::operator()() const"
               );
}

Assistant:

CordzInfo* CordzInfo::Head(const CordzSnapshot& snapshot) {
  ABSL_ASSERT(snapshot.is_snapshot());

  // We can do an 'unsafe' load of 'head', as we are guaranteed that the
  // instance it points to is kept alive by the provided CordzSnapshot, so we
  // can simply return the current value using an acquire load.
  // We do enforce in DEBUG builds that the 'head' value is present in the
  // delete queue: ODR violations may lead to 'snapshot' and 'global_list_'
  // being in different libraries / modules.
  CordzInfo* head = global_list_.head.load(std::memory_order_acquire);
  ABSL_ASSERT(snapshot.DiagnosticsHandleIsSafeToInspect(head));
  return head;
}